

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

SearchResult<unsigned_long,_false> __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
::
linear_search_impl<int,absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,int>::checked_compare>
          (btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
           *this,int *k,ulong s,ulong e)

{
  template_ElementType<3UL> *ptVar1;
  ulong uVar2;
  unsigned_long uVar3;
  long lVar4;
  
  uVar2 = s;
  if (s < e) {
    uVar2 = e;
  }
  for (lVar4 = s << 5;
      (uVar3 = uVar2, s < e &&
      (ptVar1 = GetField<3ul>(this), uVar3 = s, *(int *)((long)ptVar1 + lVar4) < *k));
      lVar4 = lVar4 + 0x20) {
    s = s + 1;
  }
  return (SearchResult<unsigned_long,_false>)uVar3;
}

Assistant:

SearchResult<size_type, false> linear_search_impl(
      const K &k, size_type s, const size_type e, const Compare &comp,
      std::false_type /* IsCompareTo */) const {
    while (s < e) {
      if (!comp(key(s), k)) {
        break;
      }
      ++s;
    }
    return SearchResult<size_type, false>{s};
  }